

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_echo_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  double dVar2;
  allocator local_ee;
  allocator local_ed;
  ipv4_address local_ec;
  ipv4_endpoint endpoint;
  epoll tep;
  echo_tester tester;
  
  if (argc == 3) {
    std::__cxx11::string::string((string *)&tester,argv[2],&local_ed);
    dVar2 = std::__cxx11::stod((string *)&tester,(size_t *)0x0);
    std::__cxx11::string::string((string *)&tep,argv[1],&local_ee);
    ipv4_address::ipv4_address(&local_ec,(string *)&tep);
    ipv4_endpoint::ipv4_endpoint(&endpoint,(uint16_t)(int)dVar2,local_ec);
    std::__cxx11::string::~string((string *)&tep);
    std::__cxx11::string::~string((string *)&tester);
    poVar1 = operator<<((ostream *)&std::cout,&endpoint);
    std::endl<char,std::char_traits<char>>(poVar1);
    sysapi::epoll::epoll(&tep);
    echo_tester::echo_tester(&tester,&tep,endpoint);
    sysapi::epoll::run(&tep);
    echo_tester::~echo_tester(&tester);
    sysapi::epoll::~epoll(&tep);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"usage: ");
    poVar1 = std::operator<<(poVar1,*argv);
    std::operator<<(poVar1," hostname port\n");
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    try
    {
        if (argc != 3)
        {
            std::cerr << "usage: " << argv[0] << " hostname port\n";
            return 0;
        }

        ipv4_endpoint endpoint(std::stod(argv[2]), ipv4_address(argv[1]));
        std::cout << endpoint << std::endl;
        sysapi::epoll tep;
        echo_tester tester{tep, endpoint};
        tep.run();
    }
    catch (std::exception const& e)
    {
        std::cerr << "error: " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    catch (...)
    {
        std::cerr << "unknown exception in main" << std::endl;
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}